

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O2

int Llb_ManMaxFanoutCi(Aig_Man_t *pAig)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  int i;
  uint uVar4;
  uint uVar5;
  
  iVar3 = -1;
  uVar4 = 0xc4653600;
  for (i = 0; i < pAig->vCis->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,i);
    uVar1 = *(uint *)((long)pvVar2 + 0x18) >> 6;
    uVar5 = uVar4;
    if ((int)uVar4 <= (int)uVar1) {
      uVar5 = uVar1;
    }
    if ((int)uVar4 < (int)uVar1) {
      iVar3 = i;
    }
    uVar4 = uVar5;
  }
  if (-1 < iVar3) {
    return iVar3;
  }
  __assert_fail("iInput >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Hint.c"
                ,0x37,"int Llb_ManMaxFanoutCi(Aig_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns CI index with the largest number of fanouts.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManMaxFanoutCi( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj; 
    int i, WeightMax = -ABC_INFINITY, iInput = -1;
    Aig_ManForEachCi( pAig, pObj, i )
        if ( WeightMax < Aig_ObjRefs(pObj) )
        {
            WeightMax = Aig_ObjRefs(pObj);
            iInput = i;
        }
    assert( iInput >= 0 );
    return iInput;
}